

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

uchar tcu::(anonymous_namespace)::convertSat<unsigned_char,unsigned_int>(uint src)

{
  byte bVar1;
  uint max;
  uint min;
  uint src_local;
  
  min._3_1_ = std::numeric_limits<unsigned_char>::min();
  bVar1 = std::numeric_limits<unsigned_char>::max();
  if ((min._3_1_ <= src) && (min._3_1_ = bVar1, src <= bVar1)) {
    min._3_1_ = (byte)src;
  }
  return min._3_1_;
}

Assistant:

static inline T convertSat (S src)
{
	S min = (S)std::numeric_limits<T>::min();
	S max = (S)std::numeric_limits<T>::max();

	if (src < min)
		return (T)min;
	else if (src > max)
		return (T)max;
	else
		return (T)src;
}